

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

Expression *
slang::ast::SimpleAssignmentPatternExpression::forStruct
          (Compilation *comp,SimpleAssignmentPatternSyntax *syntax,ASTContext *context,Type *type,
          Scope *structScope,SourceRange sourceRange)

{
  Compilation *compilation;
  Type *pTVar1;
  bool bVar2;
  int iVar3;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar4;
  ulong uVar5;
  Diagnostic *pDVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  Expression *this;
  undefined4 extraout_var;
  SimpleAssignmentPatternExpression *expr;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar8;
  Symbol *extraout_RDX;
  Symbol *extraout_RDX_00;
  specific_symbol_iterator<slang::ast::FieldSymbol> src;
  ArgumentDirection direction;
  Type *pTVar9;
  FieldSymbol *field;
  byte bVar10;
  long lVar11;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar12;
  bool isLValue;
  SmallVector<const_slang::ast::Expression_*,_5UL> elems;
  SmallVector<const_slang::ast::Type_*,_5UL> types;
  bool local_e1;
  ASTContext *local_e0;
  SimpleAssignmentPatternSyntax *local_d8;
  Type *local_d0;
  Compilation *local_c8;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_c0;
  undefined1 local_b0 [64];
  undefined1 *local_70;
  Type *local_68;
  undefined8 local_60;
  undefined1 local_58 [40];
  
  local_70 = local_58;
  local_68 = (Type *)0x0;
  local_60 = 5;
  local_e0 = context;
  local_d8 = syntax;
  local_d0 = type;
  sVar12 = Scope::membersOfType<slang::ast::FieldSymbol>(structScope);
  sVar8 = sVar12._M_end.current;
  sVar4 = sVar12._M_begin.current;
  src.current = sVar8.current;
  if (sVar4.current != sVar8.current) {
    do {
      local_b0._0_8_ = DeclaredType::getType((DeclaredType *)(sVar4.current + 1));
      SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
                ((SmallVectorBase<slang::ast::Type_const*> *)&local_70,(Type **)local_b0);
      do {
        sVar4.current = (sVar4.current)->nextInScope;
        if (sVar4.current == (Symbol *)0x0) {
          sVar4.current = (Symbol *)0x0;
          break;
        }
      } while ((sVar4.current)->kind != Field);
      src.current = extraout_RDX;
    } while (sVar4.current != sVar8.current);
  }
  pTVar1 = local_68;
  uVar5 = (local_d8->items).elements._M_extent._M_extent_value + 1;
  if (local_68 == (Type *)(uVar5 >> 1)) {
    direction = (uint)(local_e0->flags).m_bits >> 0x14 & Out;
    local_e1 = SUB41(direction,0);
    local_b0._0_8_ = local_b0 + 0x18;
    local_b0._8_8_ = 0;
    local_b0._16_8_ = 5;
    local_c8 = comp;
    if (uVar5 < 2) {
      bVar10 = 0;
    }
    else {
      lVar11 = 0;
      bVar10 = 0;
      pTVar9 = (Type *)0x0;
      do {
        ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((local_d8->items).elements._M_ptr)->super_ConstTokenOrSyntax)
                                     .
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar11));
        this = Expression::bindArgument
                         (*(Type **)(local_70 + ((ulong)pTVar9 & 0xffffffff) * 8),direction,
                          (bitmask<slang::ast::VariableFlags>)0x0,(ExpressionSyntax *)*ppSVar7,
                          local_e0);
        local_c0._M_ptr = (pointer)this;
        SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)local_b0,
                   (Expression **)&local_c0);
        bVar2 = Expression::bad(this);
        bVar10 = bVar10 | bVar2;
        pTVar9 = (Type *)((long)&(pTVar9->super_Symbol).kind + 1);
        lVar11 = lVar11 + 0x30;
        src.current = extraout_RDX_00;
      } while (pTVar1 != pTVar9);
    }
    compilation = local_c8;
    iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      ((SmallVectorBase<const_slang::ast::Expression_*> *)local_b0,
                       (EVP_PKEY_CTX *)local_c8,(EVP_PKEY_CTX *)src.current);
    local_c0._M_ptr = (pointer)CONCAT44(extraout_var,iVar3);
    expr = BumpAllocator::
           emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,bool_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                     (&compilation->super_BumpAllocator,local_d0,&local_e1,&local_c0,&sourceRange);
    if (bVar10 != 0) {
      expr = (SimpleAssignmentPatternExpression *)
             Expression::badExpr(compilation,(Expression *)expr);
    }
    if ((Type *)local_b0._0_8_ != (Type *)(local_b0 + 0x18)) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  else {
    pDVar6 = ASTContext::addDiag(local_e0,(DiagCode)0xae0007,sourceRange);
    pDVar6 = ast::operator<<(pDVar6,local_d0);
    local_b0._0_8_ = local_68;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&pDVar6->args,(unsigned_long *)local_b0);
    local_b0._0_8_ = (local_d8->items).elements._M_extent._M_extent_value + 1 >> 1;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&pDVar6->args,(unsigned_long *)local_b0);
    expr = (SimpleAssignmentPatternExpression *)Expression::badExpr(comp,(Expression *)0x0);
  }
  if (local_70 != local_58) {
    operator_delete(local_70);
  }
  return (Expression *)expr;
}

Assistant:

Expression& SimpleAssignmentPatternExpression::forStruct(
    Compilation& comp, const SimpleAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Scope& structScope, SourceRange sourceRange) {

    SmallVector<const Type*> types;
    for (auto& field : structScope.membersOfType<FieldSymbol>())
        types.push_back(&field.getType());

    if (types.size() != syntax.items.size()) {
        auto& diag = context.addDiag(diag::WrongNumberAssignmentPatterns, sourceRange);
        diag << type << types.size() << syntax.items.size();
        return badExpr(comp, nullptr);
    }

    const bool isLValue = context.flags.has(ASTFlags::LValue);
    auto direction = isLValue ? ArgumentDirection::Out : ArgumentDirection::In;

    bool bad = false;
    uint32_t index = 0;
    SmallVector<const Expression*> elems;
    for (auto item : syntax.items) {
        auto& expr = Expression::bindArgument(*types[index++], direction, {}, *item, context);
        elems.push_back(&expr);
        bad |= expr.bad();
    }

    auto result = comp.emplace<SimpleAssignmentPatternExpression>(type, isLValue, elems.copy(comp),
                                                                  sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}